

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::CompleteHandshakes(SSL *client,SSL *server)

{
  FILE *pFVar1;
  int ret_code;
  int iVar2;
  int err;
  char *pcVar3;
  int server_err;
  int server_ret;
  int client_err;
  int client_ret;
  SSL *server_local;
  SSL *client_local;
  
  while( true ) {
    ret_code = SSL_do_handshake((SSL *)client);
    iVar2 = SSL_get_error((SSL *)client,ret_code);
    pFVar1 = _stderr;
    if ((((iVar2 != 0) && (iVar2 != 2)) && (iVar2 != 3)) && (iVar2 != 0xe)) {
      pcVar3 = SSL_error_description(iVar2);
      fprintf(pFVar1,"Client error: %s\n",pcVar3);
      return false;
    }
    iVar2 = SSL_do_handshake((SSL *)server);
    err = SSL_get_error((SSL *)server,iVar2);
    pFVar1 = _stderr;
    if (((err != 0) && (err != 2)) && ((err != 3 && (err != 0xe)))) break;
    if ((ret_code == 1) && (iVar2 == 1)) {
      return true;
    }
  }
  pcVar3 = SSL_error_description(err);
  fprintf(pFVar1,"Server error: %s\n",pcVar3);
  return false;
}

Assistant:

static bool CompleteHandshakes(SSL *client, SSL *server) {
  // Drive both their handshakes to completion.
  for (;;) {
    int client_ret = SSL_do_handshake(client);
    int client_err = SSL_get_error(client, client_ret);
    if (client_err != SSL_ERROR_NONE &&        //
        client_err != SSL_ERROR_WANT_READ &&   //
        client_err != SSL_ERROR_WANT_WRITE &&  //
        client_err != SSL_ERROR_PENDING_TICKET) {
      fprintf(stderr, "Client error: %s\n", SSL_error_description(client_err));
      return false;
    }

    int server_ret = SSL_do_handshake(server);
    int server_err = SSL_get_error(server, server_ret);
    if (server_err != SSL_ERROR_NONE &&        //
        server_err != SSL_ERROR_WANT_READ &&   //
        server_err != SSL_ERROR_WANT_WRITE &&  //
        server_err != SSL_ERROR_PENDING_TICKET) {
      fprintf(stderr, "Server error: %s\n", SSL_error_description(server_err));
      return false;
    }

    if (client_ret == 1 && server_ret == 1) {
      break;
    }
  }

  return true;
}